

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<Fad<double>_>::AddSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          int64_t pRow,int64_t pCol,TPZMatrix<Fad<double>_> *pA)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  int64_t iVar9;
  long local_c0;
  Fad<double> local_b8;
  long local_98;
  long local_90;
  int64_t local_88;
  TPZMatrix<Fad<double>_> *local_80;
  long local_78;
  Fad<double> local_70;
  Fad<double> local_50;
  
  local_98 = rowSize + pRow;
  local_90 = sCol;
  local_88 = colSize;
  local_80 = this;
  if (((pA->super_TPZBaseMatrix).fRow < local_98) ||
     ((pA->super_TPZBaseMatrix).fCol < pCol + colSize)) {
    Error("AddSub <the sub-matrix is too big that target>",(char *)0x0);
  }
  if (0 < rowSize) {
    local_c0 = sRow;
    do {
      local_78 = local_90;
      iVar9 = pCol;
      if (0 < local_88) {
        do {
          (*(local_80->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_50,local_80,local_c0);
          (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_70,pA,pRow,iVar9);
          iVar3 = local_50.dx_.num_elts;
          iVar2 = local_70.dx_.num_elts;
          local_b8.val_ = local_50.val_ + local_70.val_;
          uVar1 = local_70.dx_.num_elts;
          if (local_70.dx_.num_elts < local_50.dx_.num_elts) {
            uVar1 = local_50.dx_.num_elts;
          }
          local_b8.dx_.num_elts = 0;
          local_b8.dx_.ptr_to_data = (double *)0x0;
          if (0 < (int)uVar1) {
            local_b8.dx_.num_elts = uVar1;
            local_b8.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar1 * 8);
            uVar6 = 0;
            pdVar4 = local_50.dx_.ptr_to_data;
            pdVar5 = local_70.dx_.ptr_to_data;
            do {
              pdVar7 = pdVar4;
              if (iVar3 == 0) {
                pdVar7 = &local_50.defaultVal;
              }
              pdVar8 = pdVar5;
              if (iVar2 == 0) {
                pdVar8 = &local_70.defaultVal;
              }
              local_b8.dx_.ptr_to_data[uVar6] = *pdVar7 + *pdVar8;
              uVar6 = uVar6 + 1;
              pdVar5 = pdVar5 + 1;
              pdVar4 = pdVar4 + 1;
            } while (uVar1 != uVar6);
          }
          local_b8.defaultVal = 0.0;
          (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (pA,pRow,iVar9,&local_b8);
          Fad<double>::~Fad(&local_b8);
          Fad<double>::~Fad(&local_70);
          Fad<double>::~Fad(&local_50);
          iVar9 = iVar9 + 1;
          local_78 = local_78 + 1;
        } while (iVar9 < pCol + colSize);
      }
      pRow = pRow + 1;
      local_c0 = local_c0 + 1;
    } while (pRow < local_98);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow, const int64_t sCol, const int64_t rowSize,
							const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        Error( "AddSub <the sub-matrix is too big that target>" );
    }
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col )+pA->GetVal(r,c));
        }
    }
    return( 1 );
}